

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleBuilder.cpp
# Opt level: O0

bool __thiscall Refal2::CModuleBuilder::checkModuleExist(CModuleBuilder *this,CToken *token)

{
  CToken *token_00;
  bool bVar1;
  allocator local_41;
  string local_40 [32];
  CToken *local_20;
  CToken *token_local;
  CModuleBuilder *this_local;
  
  local_20 = token;
  token_local = (CToken *)this;
  bVar1 = attemptModule(this);
  token_00 = local_20;
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Wrong function declaration out of module",&local_41);
    fatalError(this,token_00,(string *)local_40);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return bVar1;
}

Assistant:

bool CModuleBuilder::checkModuleExist( const CToken& token )
{
	if( attemptModule() ) {
		return true;
	}
	fatalError( token, "Wrong function declaration out of module" );
	return false;
}